

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O1

void __thiscall NoteOffQueue::AddNoteOff(NoteOffQueue *this,DWORD delay,BYTE channel,BYTE key)

{
  AutoNoteOff *pAVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  TArray<AutoNoteOff,_AutoNoteOff>::Grow(&this->super_TArray<AutoNoteOff,_AutoNoteOff>,1);
  uVar2 = (this->super_TArray<AutoNoteOff,_AutoNoteOff>).Count;
  (this->super_TArray<AutoNoteOff,_AutoNoteOff>).Count = uVar2 + 1;
  if (uVar2 == 0) {
LAB_0033a0e2:
    uVar4 = (ulong)uVar2;
  }
  else {
    do {
      uVar3 = (uVar2 + 1 >> 1) - 1;
      uVar4 = (ulong)uVar3;
      pAVar1 = (this->super_TArray<AutoNoteOff,_AutoNoteOff>).Array;
      if (pAVar1[uVar4].Delay <= delay) goto LAB_0033a0e2;
      pAVar1[uVar2] = pAVar1[uVar4];
      uVar2 = uVar3;
    } while (uVar3 != 0);
  }
  pAVar1 = (this->super_TArray<AutoNoteOff,_AutoNoteOff>).Array;
  pAVar1[uVar4].Delay = delay;
  pAVar1[uVar4].Channel = channel;
  pAVar1[uVar4].Key = key;
  return;
}

Assistant:

void NoteOffQueue::AddNoteOff(DWORD delay, BYTE channel, BYTE key)
{
	unsigned int i = Reserve(1);
	while (i > 0 && (*this)[Parent(i)].Delay > delay)
	{
		(*this)[i] = (*this)[Parent(i)];
		i = Parent(i);
	}
	(*this)[i].Delay = delay;
	(*this)[i].Channel = channel;
	(*this)[i].Key = key;
}